

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::recvInWorker(TCPSocket *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  element_type *peVar5;
  char *__buf;
  size_t __nbytes;
  ssize_t sVar6;
  int *piVar7;
  rep rVar8;
  long __result;
  int n;
  int localVer;
  value_type front;
  undefined1 local_68 [8];
  shared_ptr<hwnet::TCPSocket> self;
  undefined1 local_50 [7];
  bool getError;
  RecvCallback recvCallback;
  ErrorCallback errorCallback;
  TCPSocket *this_local;
  
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
             &recvCallback._M_invoker,(nullptr_t)0x0);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::function((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
              *)local_50,(nullptr_t)0x0);
  self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
            ((enable_shared_from_this<hwnet::TCPSocket> *)local_68);
  std::mutex::lock(&this->mtx);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::operator=((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
               *)local_50,&this->recvCallback_);
  bVar2 = canRead(this);
  if (bVar2) {
    if ((this->socketError & 1U) == 0) {
      pvVar4 = std::__cxx11::
               list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
               ::front(&this->recvList);
      std::shared_ptr<hwnet::Buffer>::shared_ptr((shared_ptr<hwnet::Buffer> *)&n,pvVar4);
      std::__cxx11::
      list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
      pop_front(&this->recvList);
      iVar1 = this->readableVer;
      std::mutex::unlock(&this->mtx);
      do {
        iVar3 = this->fd;
        peVar5 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&n);
        __buf = Buffer::BuffPtr(peVar5);
        peVar5 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&n);
        __nbytes = Buffer::Len(peVar5);
        sVar6 = read(iVar3,__buf,__nbytes);
        bVar2 = false;
        if (sVar6 == -1) {
          piVar7 = __errno_location();
          bVar2 = *piVar7 == 4;
        }
      } while (bVar2);
      iVar3 = (int)sVar6;
      if (iVar3 < 1) {
        std::mutex::lock(&this->mtx);
        if ((iVar3 < 0) && (piVar7 = __errno_location(), *piVar7 == 0xb)) {
          std::__cxx11::
          list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
          push_front(&this->recvList,(value_type *)&n);
          if (iVar1 == this->readableVer) {
            this->readable = false;
          }
        }
        else {
          self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = 1;
          piVar7 = __errno_location();
          this->err = *piVar7;
          this->socketError = true;
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                     &recvCallback._M_invoker,&this->errorCallback_);
        }
        std::mutex::unlock(&this->mtx);
      }
      else {
        bVar2 = std::function::operator_cast_to_bool((function *)local_50);
        if (bVar2) {
          std::
          function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
          ::operator()((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
                        *)local_50,(shared_ptr<hwnet::TCPSocket> *)local_68,
                       (shared_ptr<hwnet::Buffer> *)&n,(long)iVar3);
        }
        std::mutex::lock(&this->mtx);
        if (this->recvTimeout != 0) {
          rVar8 = std::chrono::_V2::steady_clock::now();
          (this->lastRecvTime).__d.__r = rVar8;
        }
        std::mutex::unlock(&this->mtx);
      }
      std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)&n);
    }
    else {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                 &recvCallback._M_invoker,&this->errorCallback_);
      std::mutex::unlock(&this->mtx);
      self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = 1;
    }
    if ((self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _7_1_ & 1) != 0) {
      bVar2 = std::function::operator_cast_to_bool((function *)&recvCallback._M_invoker);
      if (bVar2) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                   &recvCallback._M_invoker,(shared_ptr<hwnet::TCPSocket> *)local_68,this->err);
      }
      else {
        Close(this);
      }
    }
  }
  else {
    std::mutex::unlock(&this->mtx);
  }
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_68);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::~function((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
               *)local_50);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
             &recvCallback._M_invoker);
  return;
}

Assistant:

void TCPSocket::recvInWorker() {

	ErrorCallback errorCallback = nullptr;
	RecvCallback  recvCallback  = nullptr;
	auto getError 				= false;
	auto self 					= shared_from_this();
	this->mtx.lock();
	recvCallback = this->recvCallback_;
	
	if(!this->canRead()){
		this->mtx.unlock();
	} else {
		if(this->socketError) {
			errorCallback = this->errorCallback_;
			this->mtx.unlock();
			getError = true;
		} else {		
			auto front = recvList.front();
			recvList.pop_front();
			auto localVer = this->readableVer;
			this->mtx.unlock();

#ifdef USE_SSL
			int n = 0;
			if(this->ssl) {
				n = SSLread(this->ssl,front->BuffPtr(),front->Len());
			} else {
				n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));
			}
#else
			int n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));

#endif

			if(n > 0) {

				if(recvCallback){
					recvCallback(self,front,n);			
				}

				this->mtx.lock();
				if(this->recvTimeout > 0) {
					this->lastRecvTime = std::chrono::steady_clock::now();
				}
				this->mtx.unlock();

			} else {
				this->mtx.lock();
				if(n < 0 && errno == EAGAIN) {					
					recvList.push_front(front);
					if(localVer == this->readableVer) {
						this->readable = false;
					}
				} else {
					getError = true;
					this->err = errno;
					this->socketError = true;
					errorCallback = this->errorCallback_;	
				}
				this->mtx.unlock();			
			}
		}

		if(getError) {
			if(errorCallback) {
				errorCallback(self,err);
			} else {
				this->Close();
			}		
		}
	}
}